

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

SegmentWordCount __thiscall capnp::_::verifySegment(_ *this,ArrayPtr<const_capnp::word> segment)

{
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  
  _kjCondition.left = (ulong)this & 7;
  _kjCondition.result = _kjCondition.left == 0;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (!_kjCondition.result) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[586]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
               ,0x53,FAILED,"reinterpret_cast<uintptr_t>(segment.begin()) % sizeof(void*) == 0",
               "_kjCondition,\"Detected unaligned data in Cap\'n Proto message. Messages must be aligned to the \" \"architecture\'s word size. Yes, even on x86: Unaligned access is undefined behavior \" \"under the C/C++ language standard, and compilers can and do assume alignment for the \" \"purpose of optimizations. Unaligned access may lead to crashes or subtle corruption. \" \"For example, GCC will use SIMD instructions in optimizations, and those instrsuctions \" \"require alignment. If you really insist on taking your changes with unaligned data, \" \"compile the Cap\'n Proto library with -DCAPNP_ALLOW_UNALIGNED to remove this check.\""
               ,&_kjCondition,
               (char (*) [586])
               "Detected unaligned data in Cap\'n Proto message. Messages must be aligned to the architecture\'s word size. Yes, even on x86: Unaligned access is undefined behavior under the C/C++ language standard, and compilers can and do assume alignment for the purpose of optimizations. Unaligned access may lead to crashes or subtle corruption. For example, GCC will use SIMD instructions in optimizations, and those instrsuctions require alignment. If you really insist on taking your changes with unaligned data, compile the Cap\'n Proto library with -DCAPNP_ALLOW_UNALIGNED to remove this check."
              );
    kj::_::Debug::Fault::~Fault(&f);
  }
  if (segment.ptr < (word *)0x20000000) {
    return (SegmentWordCount)segment.ptr;
  }
  _kjCondition.left = (unsigned_long)segment.ptr;
  anon_func::anon_class_8_1_89918cff::operator()((anon_class_8_1_89918cff *)&_kjCondition);
}

Assistant:

static SegmentWordCount verifySegment(kj::ArrayPtr<const word> segment) {
#if !CAPNP_ALLOW_UNALIGNED
  KJ_REQUIRE(reinterpret_cast<uintptr_t>(segment.begin()) % sizeof(void*) == 0,
      "Detected unaligned data in Cap'n Proto message. Messages must be aligned to the "
      "architecture's word size. Yes, even on x86: Unaligned access is undefined behavior "
      "under the C/C++ language standard, and compilers can and do assume alignment for the "
      "purpose of optimizations. Unaligned access may lead to crashes or subtle corruption. "
      "For example, GCC will use SIMD instructions in optimizations, and those instrsuctions "
      "require alignment. If you really insist on taking your changes with unaligned data, "
      "compile the Cap'n Proto library with -DCAPNP_ALLOW_UNALIGNED to remove this check.") {
    break;
  }
#endif
  return verifySegmentSize(segment.size());
}